

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O1

void jpeg_write_marker(j_compress_ptr cinfo,int marker,JOCTET *dataptr,uint datalen)

{
  jpeg_error_mgr *pjVar1;
  _func_void_j_compress_ptr_int *p_Var2;
  long lVar3;
  
  if ((cinfo->next_scanline != 0) || (2 < cinfo->global_state - 0x65U)) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x14;
    (pjVar1->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  (*cinfo->marker->write_marker_header)(cinfo,marker,datalen);
  if (datalen != 0) {
    p_Var2 = cinfo->marker->write_marker_byte;
    lVar3 = 0;
    do {
      (*p_Var2)(cinfo,(int)dataptr[lVar3]);
      lVar3 = lVar3 + 1;
    } while (datalen != (uint)lVar3);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_write_marker(j_compress_ptr cinfo, int marker, const JOCTET *dataptr,
                  unsigned int datalen)
{
  void (*write_marker_byte) (j_compress_ptr info, int val);

  if (cinfo->next_scanline != 0 ||
      (cinfo->global_state != CSTATE_SCANNING &&
       cinfo->global_state != CSTATE_RAW_OK &&
       cinfo->global_state != CSTATE_WRCOEFS))
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  (*cinfo->marker->write_marker_header) (cinfo, marker, datalen);
  write_marker_byte = cinfo->marker->write_marker_byte; /* copy for speed */
  while (datalen--) {
    (*write_marker_byte) (cinfo, *dataptr);
    dataptr++;
  }
}